

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCone.cpp
# Opt level: O3

void __thiscall chrono::geometry::ChCone::ArchiveOUT(ChCone *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::geometry::ChCone>(marchive);
  ChGeometry::ArchiveOUT(&this->super_ChGeometry,marchive);
  local_38._value = &this->center;
  local_38._name = "center";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->rad;
  local_38._name = "rad";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  return;
}

Assistant:

void ChCone::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChCone>();
    // serialize parent class
    ChGeometry::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(center);
    marchive << CHNVP(rad);
}